

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

int64_t __thiscall mkvmuxer::Cluster::GetRelativeTimecode(Cluster *this,int64_t abs_timecode)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = abs_timecode - this->timecode_;
  uVar1 = 0xffffffffffffffff;
  if (uVar2 < 0x8000) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int64_t Cluster::GetRelativeTimecode(int64_t abs_timecode) const {
  const int64_t cluster_timecode = this->Cluster::timecode();
  const int64_t rel_timecode =
      static_cast<int64_t>(abs_timecode) - cluster_timecode;

  if (rel_timecode < 0 || rel_timecode > kMaxBlockTimecode)
    return -1;

  return rel_timecode;
}